

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrLDY0xa0(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  
  argument = immediate_addr((CPU *)0x1115d8);
  LDY(in_RDI,argument);
  return 2;
}

Assistant:

int CPU::instrLDY0xa0() {
	LDY(immediate_addr());
	return 2;
}